

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Compare_and_swap
              (void *origin_addr,void *compare_addr,void *result_addr,MPIABI_Datatype datatype,
              int target_rank,MPIABI_Aint target_disp,MPIABI_Win win)

{
  int iVar1;
  
  iVar1 = MPI_Compare_and_swap();
  return iVar1;
}

Assistant:

int MPIABI_Compare_and_swap(
  const void * origin_addr,
  const void * compare_addr,
  void * result_addr,
  MPIABI_Datatype datatype,
  int target_rank,
  MPIABI_Aint target_disp,
  MPIABI_Win win
) {
  return MPI_Compare_and_swap(
    origin_addr,
    compare_addr,
    result_addr,
    (MPI_Datatype)(WPI_Datatype)datatype,
    target_rank,
    (MPI_Aint)(WPI_Aint)target_disp,
    (MPI_Win)(WPI_Win)win
  );
}